

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

int memCmp(void *buf1,void *buf2,size_t count)

{
  bool bVar1;
  byte bVar2;
  size_t filled;
  octet *b2;
  octet *b1;
  word w2;
  word w1;
  word greater;
  word less;
  size_t count_local;
  void *buf2_local;
  void *buf1_local;
  
  bVar1 = false;
  bVar2 = 0;
  w1 = 0;
  w2 = 0;
  filled = 0;
  b2 = (octet *)buf2;
  b1 = (octet *)buf1;
  count_local = count;
  while (count_local != 0) {
    w1 = w1 << 8 | (ulong)*b1;
    w2 = w2 << 8 | (ulong)*b2;
    filled = filled + 1;
    if (filled == 8) {
      bVar1 = (bool)((bVar2 ^ 1) & w1 < w2 | bVar1);
      bVar2 = (bVar1 ^ 1U) & w2 < w1 | bVar2;
      filled = 0;
    }
    b1 = b1 + 1;
    b2 = b2 + 1;
    count_local = count_local - 1;
  }
  if (filled != 0) {
    bVar1 = (bool)((bVar2 ^ 1) & w1 < w2 | bVar1);
    bVar2 = (bVar1 ^ 1U) & w2 < w1 | bVar2;
  }
  return !bVar1 - 1 | (uint)bVar2;
}

Assistant:

int SAFE(memCmp)(const void* buf1, const void* buf2, size_t count)
{
	register word less = 0;
	register word greater = 0;
	register word w1 = 0;
	register word w2 = 0;
	const octet* b1 = (const octet*)buf1;
	const octet* b2 = (const octet*)buf2;
	size_t filled = 0;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	for (; count--; ++b1, ++b2)
	{
		w1 = w1 << 8 | *b1;
		w2 = w2 << 8 | *b2;
		if (++filled == O_PER_W)
		{
			less |= ~greater & wordLess(w1, w2);
			greater |= ~less & wordGreater(w1, w2);
			filled = 0;
		}
	}
	if (filled)
	{
		less |= ~greater & wordLess(w1, w2);
		greater |= ~less & wordGreater(w1, w2);
	}
	w1 = w2 = 0;
	return (wordEq(less, 0) - 1) | wordNeq(greater, 0);
}